

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::
vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
::push_back(vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
            *this,LensElementInterface *value)

{
  LensElementInterface *pLVar1;
  size_t sVar2;
  Float FVar3;
  Float FVar4;
  Float FVar5;
  size_t n;
  
  sVar2 = this->nAlloc;
  if (sVar2 == this->nStored) {
    n = 4;
    if (sVar2 != 0) {
      n = sVar2 * 2;
    }
    reserve(this,n);
  }
  FVar3 = value->thickness;
  FVar4 = value->eta;
  FVar5 = value->apertureRadius;
  pLVar1 = this->ptr + this->nStored;
  pLVar1->curvatureRadius = value->curvatureRadius;
  pLVar1->thickness = FVar3;
  pLVar1->eta = FVar4;
  pLVar1->apertureRadius = FVar5;
  this->nStored = this->nStored + 1;
  return;
}

Assistant:

void push_back(T &&value) {
        if (nAlloc == nStored)
            reserve(nAlloc == 0 ? 4 : 2 * nAlloc);

        alloc.construct(ptr + nStored, std::move(value));
        ++nStored;
    }